

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

void If_CutSort(If_Man_t *p,If_Set_t *pCutSet,If_Cut_t *pCut)

{
  short sVar1;
  If_Par_t *pIVar2;
  If_Cut_t *pC0;
  int iVar3;
  long lVar4;
  
  while( true ) {
    sVar1 = pCutSet->nCuts;
    if (pCutSet->ppCuts[sVar1] != pCut) {
      __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x2e8,"void If_CutSort(If_Man_t *, If_Set_t *, If_Cut_t *)");
    }
    if (pCutSet->nCutsMax < sVar1) {
      __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x2e9,"void If_CutSort(If_Man_t *, If_Set_t *, If_Cut_t *)");
    }
    if (sVar1 == 0) {
      pCutSet->nCuts = 1;
      return;
    }
    if ((((pCut->field_0x1d & 0x40) != 0) ||
        ((((((pIVar2 = p->pPars, pIVar2->fUseDsd == 0 &&
             (pIVar2->pFuncCell2 ==
              (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) &&
            (pIVar2->fUseBat == 0)) &&
           ((pIVar2->pLutStruct == (char *)0x0 && (pIVar2->fUserRecLib == 0)))) &&
          (((pIVar2->fUserSesLib == 0 &&
            ((pIVar2->fEnableCheck07 == 0 && (pIVar2->fUseCofVars == 0)))) &&
           (pIVar2->fUseAndVars == 0)))) &&
         ((((pIVar2->fUse34Spec == 0 && (pIVar2->fUseDsdTune == 0)) && (pIVar2->fEnableCheck75 == 0)
           ) && (pIVar2->fEnableCheck75u == 0)))))) ||
       ((pC0 = *pCutSet->ppCuts, (pC0->field_0x1d & 0x40) == 0 &&
        (iVar3 = If_ManSortCompare(p,pC0,pCut), iVar3 != 1)))) break;
    *pCutSet->ppCuts = pCut;
    pCutSet->ppCuts[pCutSet->nCuts] = pC0;
    pCut = pC0;
  }
  if (0 < (long)pCutSet->nCuts) {
    lVar4 = (long)pCutSet->nCuts + 1;
    do {
      iVar3 = If_ManSortCompare(p,pCutSet->ppCuts[lVar4 + -2],pCut);
      if ((iVar3 < 1) ||
         (((lVar4 == 2 && (((*pCutSet->ppCuts)->field_0x1d & 0x40) == 0)) &&
          ((pCut->field_0x1d & 0x40) != 0)))) break;
      pCutSet->ppCuts[lVar4 + -1] = pCutSet->ppCuts[lVar4 + -2];
      pCutSet->ppCuts[lVar4 + -2] = pCut;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  if (pCutSet->nCuts < pCutSet->nCutsMax) {
    pCutSet->nCuts = pCutSet->nCuts + 1;
  }
  return;
}

Assistant:

void If_CutSort( If_Man_t * p, If_Set_t * pCutSet, If_Cut_t * pCut )
{
//    int Counter = 0;
    int i;

    // the new cut is the last one
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    assert( pCutSet->nCuts <= pCutSet->nCutsMax );

    // cut structure is empty
    if ( pCutSet->nCuts == 0 )
    {
        pCutSet->nCuts++;
        return;
    }

    if ( !pCut->fUseless && 
         (p->pPars->fUseDsd || p->pPars->pFuncCell2 || p->pPars->fUseBat || 
          p->pPars->pLutStruct || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
          p->pPars->fEnableCheck07 || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || 
          p->pPars->fUseDsdTune || p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) )
    {
        If_Cut_t * pFirst = pCutSet->ppCuts[0];
        if ( pFirst->fUseless || If_ManSortCompare(p, pFirst, pCut) == 1 )
        {
            pCutSet->ppCuts[0] = pCut;
            pCutSet->ppCuts[pCutSet->nCuts] = pFirst;
            If_CutSort( p, pCutSet, pFirst );
            return;
        }
    }

    // the cut will be added - find its place
    for ( i = pCutSet->nCuts-1; i >= 0; i-- )
    {
//        Counter++;
        if ( If_ManSortCompare( p, pCutSet->ppCuts[i], pCut ) <= 0 || (i == 0 && !pCutSet->ppCuts[0]->fUseless && pCut->fUseless) )
            break;
        pCutSet->ppCuts[i+1] = pCutSet->ppCuts[i];
        pCutSet->ppCuts[i] = pCut;
    }
//    Abc_Print( 1, "%d ", Counter );

    // update the number of cuts
    if ( pCutSet->nCuts < pCutSet->nCutsMax )
        pCutSet->nCuts++;
}